

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

void __thiscall jaegertracing::Tracer::~Tracer(Tracer *this)

{
  Tracer *this_local;
  
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_004f9508;
  (*(this->super_Tracer)._vptr_Tracer[0xb])();
  std::
  unique_ptr<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  ::~unique_ptr(&this->_restrictionManager);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&this->_tags);
  propagation::BinaryPropagator::~BinaryPropagator(&this->_binaryPropagator);
  propagation::HTTPHeaderPropagator::~HTTPHeaderPropagator(&this->_httpHeaderPropagator);
  propagation::
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
  ~Propagator(&this->_textPropagator);
  std::shared_ptr<jaegertracing::logging::Logger>::~shared_ptr(&this->_logger);
  std::shared_ptr<jaegertracing::metrics::Metrics>::~shared_ptr(&this->_metrics);
  std::shared_ptr<jaegertracing::reporters::Reporter>::~shared_ptr(&this->_reporter);
  std::shared_ptr<jaegertracing::samplers::Sampler>::~shared_ptr(&this->_sampler);
  std::__cxx11::string::~string((string *)&this->_serviceName);
  std::enable_shared_from_this<jaegertracing::Tracer>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<jaegertracing::Tracer>);
  opentracing::v3::Tracer::~Tracer(&this->super_Tracer);
  return;
}

Assistant:

~Tracer() { Close(); }